

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::check_portable_serialization(roaring64_bitmap_t *r1)

{
  _Bool _Var1;
  char *buf_00;
  char *maxbytes;
  vector<char,_std::allocator<char>_> *this;
  roaring64_bitmap_t *expression;
  roaring64_bitmap_t *unaff_retaddr;
  roaring64_bitmap_t *r2;
  size_t deserialized_size;
  size_t serialized;
  vector<char,_std::allocator<char>_> buf;
  size_t serialized_size;
  roaring64_bitmap_t *in_stack_000000c0;
  roaring64_bitmap_t *in_stack_000000c8;
  roaring64_bitmap_t *in_stack_000000e0;
  roaring64_bitmap_t *in_stack_000000e8;
  int in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  allocator_type *in_stack_ffffffffffffff78;
  value_type_conflict *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  vector<char,_std::allocator<char>_> *maxbytes_00;
  char *buf_01;
  allocator<char> local_2a;
  undefined1 local_29;
  char *local_10;
  
  buf_00 = (char *)roaring64_bitmap_portable_size_in_bytes(in_stack_000000e0);
  local_29 = 0;
  local_10 = buf_00;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  std::allocator<char>::~allocator(&local_2a);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x10a361);
  maxbytes = (char *)roaring64_bitmap_portable_serialize
                               (in_stack_000000e8,(char *)in_stack_000000e0);
  buf_01 = maxbytes;
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff80,
                    (unsigned_long)in_stack_ffffffffffffff78,
                    (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff6c);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x10a3a9);
  this = (vector<char,_std::allocator<char>_> *)
         roaring64_bitmap_portable_deserialize_size(buf_00,(size_t)maxbytes);
  maxbytes_00 = this;
  _assert_int_equal((unsigned_long)this,(unsigned_long)in_stack_ffffffffffffff78,
                    (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff6c);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x10a3f3);
  expression = roaring64_bitmap_portable_deserialize_safe(buf_01,(size_t)maxbytes_00);
  assert_r64_valid((roaring64_bitmap_t *)
                   CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  _Var1 = roaring64_bitmap_equals(in_stack_000000c8,in_stack_000000c0);
  _assert_true((unsigned_long)this,(char *)expression,
               (char *)CONCAT17(_Var1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c);
  roaring64_bitmap_free(unaff_retaddr);
  std::vector<char,_std::allocator<char>_>::~vector(this);
  return;
}

Assistant:

void check_portable_serialization(const roaring64_bitmap_t* r1) {
    size_t serialized_size = roaring64_bitmap_portable_size_in_bytes(r1);
    std::vector<char> buf(serialized_size, 0);
    size_t serialized = roaring64_bitmap_portable_serialize(r1, buf.data());
    assert_int_equal(serialized, serialized_size);
    size_t deserialized_size =
        roaring64_bitmap_portable_deserialize_size(buf.data(), SIZE_MAX);
    assert_int_equal(deserialized_size, serialized_size);
    roaring64_bitmap_t* r2 =
        roaring64_bitmap_portable_deserialize_safe(buf.data(), serialized_size);
    assert_r64_valid(r2);
    assert_true(roaring64_bitmap_equals(r2, r1));
    roaring64_bitmap_free(r2);
}